

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int upsampled_pref_error
              (MACROBLOCKD *xd,AV1_COMMON *cm,MV *this_mv,SUBPEL_SEARCH_VAR_PARAMS *var_params,
              uint *sse)

{
  byte bVar1;
  undefined4 uVar2;
  int mi_col_00;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  uint8_t *comp_pred;
  long lVar6;
  long lVar7;
  int iVar8;
  long *in_RCX;
  MV *in_RDX;
  MACROBLOCKD *in_RDI;
  undefined8 in_R8;
  uint8_t pred [16384];
  uint8_t *pred8;
  uint16_t pred16 [16384];
  uint besterr;
  int subpel_y_q3;
  int subpel_x_q3;
  int mi_col;
  int mi_row;
  int h;
  int w;
  int invert_mask;
  int mask_stride;
  uint8_t *mask;
  uint8_t *second_pred;
  int ref_stride;
  int src_stride;
  uint8_t *ref;
  uint8_t *src;
  MSBuffers *ms_buffers;
  SUBPEL_SEARCH_TYPE subpel_search_type;
  aom_variance_fn_ptr_t *vfp;
  undefined4 in_stack_ffffffffffff3edc;
  int in_stack_ffffffffffff3ee4;
  int in_stack_ffffffffffff3eec;
  undefined4 in_stack_ffffffffffff3ef0;
  undefined4 in_stack_ffffffffffff3ef4;
  MACROBLOCKD *in_stack_ffffffffffff3ef8;
  MV *in_stack_ffffffffffff3f00;
  int in_stack_ffffffffffff3f08;
  int in_stack_ffffffffffff3f0c;
  AV1Common *in_stack_ffffffffffff3f10;
  int in_stack_ffffffffffff3f18;
  int in_stack_ffffffffffff3f1c;
  undefined4 in_stack_ffffffffffff3f20;
  undefined4 in_stack_ffffffffffff3f24;
  int in_stack_ffffffffffff3f28;
  undefined4 in_stack_ffffffffffff3f2c;
  int in_stack_ffffffffffff3f30;
  undefined4 in_stack_ffffffffffff3f34;
  int in_stack_ffffffffffff3f38;
  int in_stack_ffffffffffff3f40;
  int in_stack_ffffffffffff3f48;
  undefined4 in_stack_ffffffffffff3f4c;
  int in_stack_ffffffffffff3f50;
  uint8_t *in_stack_ffffffffffff3f58;
  int in_stack_ffffffffffff3f60;
  int in_stack_ffffffffffff3f68;
  undefined4 in_stack_ffffffffffff3f6c;
  int in_stack_ffffffffffff3f70;
  undefined4 in_stack_ffffffffffff3f74;
  int in_stack_ffffffffffff3f78;
  int in_stack_ffffffffffff3f80;
  int in_stack_ffffffffffff3f88;
  int in_stack_ffffffffffff3f90;
  uint8_t *in_stack_ffffffffffff3f98;
  int in_stack_ffffffffffff3fa0;
  int in_stack_ffffffffffff3fa8;
  uint8_t *in_stack_ffffffffffff3fb0;
  int in_stack_ffffffffffff3fb8;
  int in_stack_ffffffffffff3fc0;
  int in_stack_ffffffffffff3fc8;
  int in_stack_ffffffffffff3fd0;
  uint8_t *in_stack_ffffffffffff3fd8;
  int in_stack_ffffffffffff3fe0;
  int in_stack_ffffffffffff3fe8;
  int in_stack_ffffffffffff3ff0;
  undefined1 local_80c8 [20992];
  uint8_t *in_stack_ffffffffffffd138;
  MV *in_stack_ffffffffffffd140;
  int in_stack_ffffffffffffd148;
  int in_stack_ffffffffffffd14c;
  AV1Common *in_stack_ffffffffffffd150;
  MACROBLOCKD *in_stack_ffffffffffffd158;
  int in_stack_ffffffffffffd210;
  int in_stack_ffffffffffffd218;
  int in_stack_ffffffffffffd220;
  int in_stack_ffffffffffffd228;
  uint8_t *in_stack_ffffffffffffd230;
  int in_stack_ffffffffffffd238;
  int in_stack_ffffffffffffd240;
  uint8_t *in_stack_ffffffffffffe108;
  MV *in_stack_ffffffffffffe110;
  int in_stack_ffffffffffffe118;
  int in_stack_ffffffffffffe11c;
  AV1Common *in_stack_ffffffffffffe120;
  MACROBLOCKD *in_stack_ffffffffffffe128;
  int in_stack_ffffffffffffe200;
  int in_stack_ffffffffffffe208;
  int in_stack_ffffffffffffe210;
  int in_stack_ffffffffffffe218;
  uint8_t *in_stack_ffffffffffffe220;
  int in_stack_ffffffffffffe228;
  int in_stack_ffffffffffffe230;
  int in_stack_ffffffffffffe238;
  int local_bc;
  
  lVar3 = *in_RCX;
  bVar1 = *(byte *)(in_RCX + 1);
  uVar4 = *(undefined8 *)in_RCX[3];
  get_buf_from_mv((buf_2d *)in_RCX[2],*in_RDX);
  uVar2 = *(undefined4 *)(in_RCX[3] + 0x18);
  lVar5 = in_RCX[4];
  comp_pred = (uint8_t *)in_RCX[5];
  lVar6 = in_RCX[6];
  mi_col_00 = *(int *)((long)in_RCX + 0x34);
  lVar7 = in_RCX[9];
  get_subpel_part((int)in_RDX->col);
  get_subpel_part((int)in_RDX->row);
  iVar8 = is_cur_buf_hbd(in_RDI);
  if (iVar8 == 0) {
    if (lVar5 == 0) {
      aom_upsampled_pred_sse2
                (in_stack_ffffffffffffd158,in_stack_ffffffffffffd150,in_stack_ffffffffffffd14c,
                 in_stack_ffffffffffffd148,in_stack_ffffffffffffd140,in_stack_ffffffffffffd138,
                 in_stack_ffffffffffffd210,in_stack_ffffffffffffd218,in_stack_ffffffffffffd220,
                 in_stack_ffffffffffffd228,in_stack_ffffffffffffd230,in_stack_ffffffffffffd238,
                 in_stack_ffffffffffffd240);
    }
    else if (comp_pred == (uint8_t *)0x0) {
      aom_comp_avg_upsampled_pred_sse2
                ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffff3f1c,in_stack_ffffffffffff3f18),
                 in_stack_ffffffffffff3f10,in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08,
                 in_stack_ffffffffffff3f00,(uint8_t *)in_stack_ffffffffffff3ef8,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffff3f74,in_stack_ffffffffffff3f70),
                 in_stack_ffffffffffff3f78,in_stack_ffffffffffff3f80,in_stack_ffffffffffff3f88,
                 in_stack_ffffffffffff3f90,in_stack_ffffffffffff3f98,in_stack_ffffffffffff3fa0,
                 in_stack_ffffffffffff3fa8);
    }
    else {
      aom_comp_mask_upsampled_pred
                ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffff3ef4,in_stack_ffffffffffff3ef0),
                 (AV1_COMMON *)CONCAT44(in_stack_ffffffffffff3eec,(uint)bVar1),
                 in_stack_ffffffffffff3ee4,mi_col_00,
                 (MV *)CONCAT44(in_stack_ffffffffffff3edc,(int)lVar6),comp_pred,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffff3f24,in_stack_ffffffffffff3f20),
                 in_stack_ffffffffffff3f28,in_stack_ffffffffffff3f30,in_stack_ffffffffffff3f38,
                 in_stack_ffffffffffff3f40,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffff3f4c,in_stack_ffffffffffff3f48),
                 in_stack_ffffffffffff3f50,in_stack_ffffffffffff3f58,in_stack_ffffffffffff3f60,
                 in_stack_ffffffffffff3f68,in_stack_ffffffffffff3f70);
    }
    local_bc = (**(code **)(lVar3 + 0x18))(&stack0xffffffffffff3f28,(int)lVar7,uVar4,uVar2,in_R8);
  }
  else {
    if (lVar5 == 0) {
      aom_highbd_upsampled_pred_sse2
                (in_stack_ffffffffffffe128,in_stack_ffffffffffffe120,in_stack_ffffffffffffe11c,
                 in_stack_ffffffffffffe118,in_stack_ffffffffffffe110,in_stack_ffffffffffffe108,
                 in_stack_ffffffffffffe200,in_stack_ffffffffffffe208,in_stack_ffffffffffffe210,
                 in_stack_ffffffffffffe218,in_stack_ffffffffffffe220,in_stack_ffffffffffffe228,
                 in_stack_ffffffffffffe230,in_stack_ffffffffffffe238);
    }
    else if (comp_pred == (uint8_t *)0x0) {
      aom_highbd_comp_avg_upsampled_pred_sse2
                ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffff3f2c,in_stack_ffffffffffff3f28),
                 (AV1Common *)CONCAT44(in_stack_ffffffffffff3f24,in_stack_ffffffffffff3f20),
                 in_stack_ffffffffffff3f1c,in_stack_ffffffffffff3f18,(MV *)in_stack_ffffffffffff3f10
                 ,(uint8_t *)CONCAT44(in_stack_ffffffffffff3f0c,in_stack_ffffffffffff3f08),
                 in_stack_ffffffffffff3fb0,in_stack_ffffffffffff3fb8,in_stack_ffffffffffff3fc0,
                 in_stack_ffffffffffff3fc8,in_stack_ffffffffffff3fd0,in_stack_ffffffffffff3fd8,
                 in_stack_ffffffffffff3fe0,in_stack_ffffffffffff3fe8,in_stack_ffffffffffff3ff0);
    }
    else {
      aom_highbd_comp_mask_upsampled_pred
                (in_stack_ffffffffffff3ef8,
                 (AV1Common *)CONCAT44(in_stack_ffffffffffff3ef4,(uint)bVar1),
                 in_stack_ffffffffffff3eec,in_RDI->bd,
                 (MV *)CONCAT44(in_stack_ffffffffffff3ee4,mi_col_00),
                 (uint8_t *)CONCAT44(in_stack_ffffffffffff3edc,(int)lVar6),
                 (uint8_t *)CONCAT44(in_stack_ffffffffffff3f34,in_stack_ffffffffffff3f30),
                 in_stack_ffffffffffff3f38,in_stack_ffffffffffff3f40,in_stack_ffffffffffff3f48,
                 in_stack_ffffffffffff3f50,in_stack_ffffffffffff3f58,in_stack_ffffffffffff3f60,
                 (uint8_t *)CONCAT44(in_stack_ffffffffffff3f6c,in_stack_ffffffffffff3f68),
                 in_stack_ffffffffffff3f70,in_stack_ffffffffffff3f78,in_stack_ffffffffffff3f80,
                 in_stack_ffffffffffff3f88);
    }
    local_bc = (**(code **)(lVar3 + 0x18))((ulong)local_80c8 >> 1,(int)lVar7,uVar4,uVar2,in_R8);
  }
  return local_bc;
}

Assistant:

static int upsampled_pref_error(MACROBLOCKD *xd, const AV1_COMMON *cm,
                                const MV *this_mv,
                                const SUBPEL_SEARCH_VAR_PARAMS *var_params,
                                unsigned int *sse) {
  const aom_variance_fn_ptr_t *vfp = var_params->vfp;
  const SUBPEL_SEARCH_TYPE subpel_search_type = var_params->subpel_search_type;

  const MSBuffers *ms_buffers = &var_params->ms_buffers;
  const uint8_t *src = ms_buffers->src->buf;
  const uint8_t *ref = get_buf_from_mv(ms_buffers->ref, *this_mv);
  const int src_stride = ms_buffers->src->stride;
  const int ref_stride = ms_buffers->ref->stride;
  const uint8_t *second_pred = ms_buffers->second_pred;
  const uint8_t *mask = ms_buffers->mask;
  const int mask_stride = ms_buffers->mask_stride;
  const int invert_mask = ms_buffers->inv_mask;
  const int w = var_params->w;
  const int h = var_params->h;

  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int subpel_x_q3 = get_subpel_part(this_mv->col);
  const int subpel_y_q3 = get_subpel_part(this_mv->row);

  unsigned int besterr;
#if CONFIG_AV1_HIGHBITDEPTH
  if (is_cur_buf_hbd(xd)) {
    DECLARE_ALIGNED(16, uint16_t, pred16[MAX_SB_SQUARE]);
    uint8_t *pred8 = CONVERT_TO_BYTEPTR(pred16);
    if (second_pred != NULL) {
      if (mask) {
        aom_highbd_comp_mask_upsampled_pred(
            xd, cm, mi_row, mi_col, this_mv, pred8, second_pred, w, h,
            subpel_x_q3, subpel_y_q3, ref, ref_stride, mask, mask_stride,
            invert_mask, xd->bd, subpel_search_type);
      } else {
        aom_highbd_comp_avg_upsampled_pred(
            xd, cm, mi_row, mi_col, this_mv, pred8, second_pred, w, h,
            subpel_x_q3, subpel_y_q3, ref, ref_stride, xd->bd,
            subpel_search_type);
      }
    } else {
      aom_highbd_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred8, w, h,
                                subpel_x_q3, subpel_y_q3, ref, ref_stride,
                                xd->bd, subpel_search_type);
    }
    besterr = vfp->vf(pred8, w, src, src_stride, sse);
  } else {
    DECLARE_ALIGNED(16, uint8_t, pred[MAX_SB_SQUARE]);
    if (second_pred != NULL) {
      if (mask) {
        aom_comp_mask_upsampled_pred(
            xd, cm, mi_row, mi_col, this_mv, pred, second_pred, w, h,
            subpel_x_q3, subpel_y_q3, ref, ref_stride, mask, mask_stride,
            invert_mask, subpel_search_type);
      } else {
        aom_comp_avg_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred,
                                    second_pred, w, h, subpel_x_q3, subpel_y_q3,
                                    ref, ref_stride, subpel_search_type);
      }
    } else {
      aom_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred, w, h,
                         subpel_x_q3, subpel_y_q3, ref, ref_stride,
                         subpel_search_type);
    }

    besterr = vfp->vf(pred, w, src, src_stride, sse);
  }
#else
  DECLARE_ALIGNED(16, uint8_t, pred[MAX_SB_SQUARE]);
  if (second_pred != NULL) {
    if (mask) {
      aom_comp_mask_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred,
                                   second_pred, w, h, subpel_x_q3, subpel_y_q3,
                                   ref, ref_stride, mask, mask_stride,
                                   invert_mask, subpel_search_type);
    } else {
      aom_comp_avg_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred,
                                  second_pred, w, h, subpel_x_q3, subpel_y_q3,
                                  ref, ref_stride, subpel_search_type);
    }
  } else {
    aom_upsampled_pred(xd, cm, mi_row, mi_col, this_mv, pred, w, h, subpel_x_q3,
                       subpel_y_q3, ref, ref_stride, subpel_search_type);
  }

  besterr = vfp->vf(pred, w, src, src_stride, sse);
#endif
  return besterr;
}